

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O2

void __thiscall pbrt::MetalMaterial::readFrom(MetalMaterial *this,BinaryReader *binary)

{
  Material::readFrom(&this->super_Material,binary);
  BinaryReader::read<float,void>(binary,&this->roughness);
  BinaryReader::read<float,void>(binary,&this->uRoughness);
  BinaryReader::read<float,void>(binary,&this->vRoughness);
  BinaryReader::read<bool,void>(binary,&this->remapRoughness);
  (*(this->spectrum_eta).super_Entity._vptr_Entity[2])(&this->spectrum_eta,binary);
  (*(this->spectrum_k).super_Entity._vptr_Entity[2])(&this->spectrum_k,binary);
  BinaryReader::read<pbrt::math::vec3f,void>(binary,&this->eta);
  BinaryReader::read<pbrt::math::vec3f,void>(binary,&this->k);
  BinaryReader::read<pbrt::Texture>(binary,&this->map_bump);
  BinaryReader::read<pbrt::Texture>(binary,&this->map_roughness);
  BinaryReader::read<pbrt::Texture>(binary,&this->map_uRoughness);
  BinaryReader::read<pbrt::Texture>(binary,&this->map_vRoughness);
  return;
}

Assistant:

void MetalMaterial::readFrom(BinaryReader &binary) 
  {
    Material::readFrom(binary);
    binary.read(roughness);
    binary.read(uRoughness);
    binary.read(vRoughness);
    binary.read(remapRoughness);
    binary.read(spectrum_eta);
    binary.read(spectrum_k);
    binary.read(eta);
    binary.read(k);
    binary.read(map_bump);
    binary.read(map_roughness);
    binary.read(map_uRoughness);
    binary.read(map_vRoughness);
  }